

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O0

void __thiscall
flatbuffers::cpp::CppGenerator::GenNativeTablePost(CppGenerator *this,StructDef *struct_def)

{
  undefined8 struct_def_00;
  allocator<char> local_121;
  string local_120;
  allocator<char> local_f9;
  string local_f8;
  allocator<char> local_d1;
  string local_d0;
  string local_b0;
  allocator<char> local_89;
  string local_88;
  string local_58;
  undefined1 local_38 [8];
  string native_name;
  StructDef *struct_def_local;
  CppGenerator *this_local;
  
  if (((this->opts_).super_IDLOptions.gen_compare & 1U) != 0) {
    native_name.field_2._8_8_ = struct_def;
    Name_abi_cxx11_(&local_58,this,&struct_def->super_Definition);
    NativeName((string *)local_38,&local_58,(StructDef *)native_name.field_2._8_8_,
               &(this->opts_).super_IDLOptions);
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"STRUCT_NAME",&local_89);
    Name_abi_cxx11_(&local_b0,this,(Definition *)native_name.field_2._8_8_);
    CodeWriter::SetValue(&this->code_,&local_88,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator(&local_89);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"NATIVE_NAME",&local_d1);
    CodeWriter::SetValue(&this->code_,&local_d0,(string *)local_38);
    std::__cxx11::string::~string((string *)&local_d0);
    std::allocator<char>::~allocator(&local_d1);
    struct_def_00 = native_name.field_2._8_8_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"",&local_f9);
    GenCompareOperator(this,(StructDef *)struct_def_00,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::allocator<char>::~allocator(&local_f9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,"",&local_121);
    CodeWriter::operator+=(&this->code_,&local_120);
    std::__cxx11::string::~string((string *)&local_120);
    std::allocator<char>::~allocator(&local_121);
    std::__cxx11::string::~string((string *)local_38);
  }
  return;
}

Assistant:

void GenNativeTablePost(const StructDef &struct_def) {
    if (opts_.gen_compare) {
      const auto native_name = NativeName(Name(struct_def), &struct_def, opts_);
      code_.SetValue("STRUCT_NAME", Name(struct_def));
      code_.SetValue("NATIVE_NAME", native_name);
      GenCompareOperator(struct_def);
      code_ += "";
    }
  }